

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

void __thiscall Matrix::LowerTriangular(Matrix *this)

{
  double **ppdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int j;
  ulong uVar5;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)this->colNo;
  if (this->colNo < 1) {
    uVar2 = uVar3;
  }
  uVar4 = (ulong)(uint)this->rowNo;
  if (this->rowNo < 1) {
    uVar4 = uVar3;
  }
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    ppdVar1 = this->array;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      if (uVar3 < uVar5) {
        ppdVar1[uVar3][uVar5] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void Matrix::LowerTriangular()
{
    for (int i = 0; i < rowNo; i++)
    {
        for (int j = 0; j < colNo; j++)
        {
            if (i < j)
            {
                array[i][j] = 0;
            }
        }
    }

}